

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CheckEnumValueUniqueness
          (DescriptorBuilder *this,EnumDescriptorProto *proto,EnumDescriptor *result)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Syntax SVar4;
  string *psVar5;
  pointer ppVar6;
  string *__rhs;
  mapped_type *ppEVar7;
  FileDescriptor *this_00;
  EnumValueDescriptorProto *pEVar8;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_const_EnumValueDescriptor_*>_>::value,_pair<iterator,_bool>_>
  _Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 local_160 [8];
  string error_message;
  bool inserted;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>
  local_128;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>
  local_100;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>,_bool>
  insert_result;
  string local_e0;
  undefined1 local_c0 [8];
  string stripped;
  EnumValueDescriptor *value;
  int local_84;
  undefined1 local_80 [4];
  int i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  values;
  undefined1 local_40 [8];
  PrefixRemover remover;
  EnumDescriptor *result_local;
  EnumDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  remover.prefix_.field_2._8_8_ = result;
  psVar5 = EnumDescriptor::name_abi_cxx11_(result);
  StringPiece::StringPiece<std::allocator<char>>
            ((StringPiece *)&values._M_t._M_impl.super__Rb_tree_header._M_node_count,psVar5);
  anon_unknown_1::PrefixRemover::PrefixRemover((PrefixRemover *)local_40,stack0xffffffffffffffb0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
         *)local_80);
  for (local_84 = 0;
      iVar2 = EnumDescriptor::value_count((EnumDescriptor *)remover.prefix_.field_2._8_8_),
      local_84 < iVar2; local_84 = local_84 + 1) {
    stripped.field_2._8_8_ =
         (size_type)EnumDescriptor::value(remover.prefix_.field_2._8_8_,local_84);
    psVar5 = EnumValueDescriptor::name_abi_cxx11_((EnumValueDescriptor *)stripped.field_2._8_8_);
    StringPiece::StringPiece<std::allocator<char>>((StringPiece *)&insert_result.second,psVar5);
    (anonymous_namespace)::PrefixRemover::MaybeRemove_abi_cxx11_
              (&local_e0,local_40,stack0xffffffffffffff10);
    anon_unknown_1::EnumValueToPascalCase((string *)local_c0,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::make_pair<std::__cxx11::string&,google::protobuf::EnumValueDescriptor_const*&>
              (&local_128,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
               (EnumValueDescriptor **)((long)&stripped.field_2 + 8));
    _Var9 = std::
            map<std::__cxx11::string,google::protobuf::EnumValueDescriptor_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>>>
            ::insert<std::pair<std::__cxx11::string,google::protobuf::EnumValueDescriptor_const*>>
                      ((map<std::__cxx11::string,google::protobuf::EnumValueDescriptor_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::EnumValueDescriptor_const*>>>
                        *)local_80,&local_128);
    local_100 = _Var9.first._M_node;
    insert_result.first._M_node._0_1_ = _Var9.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>
    ::~pair(&local_128);
    error_message.field_2._M_local_buf[0xf] = (byte)insert_result.first._M_node & 1;
    if (error_message.field_2._M_local_buf[0xf] == 0) {
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>
               ::operator->(&local_100);
      psVar5 = EnumValueDescriptor::name_abi_cxx11_(ppVar6->second);
      __rhs = EnumValueDescriptor::name_abi_cxx11_((EnumValueDescriptor *)stripped.field_2._8_8_);
      bVar1 = std::operator!=(psVar5,__rhs);
      if (bVar1) {
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>
                 ::operator->(&local_100);
        iVar2 = EnumValueDescriptor::number(ppVar6->second);
        iVar3 = EnumValueDescriptor::number((EnumValueDescriptor *)stripped.field_2._8_8_);
        if (iVar2 != iVar3) {
          std::operator+(&local_1c0,"When enum name is stripped and label is PascalCased (",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c0);
          std::operator+(&local_1a0,&local_1c0,"), this value label conflicts with ");
          ppEVar7 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                                  *)local_80,(key_type *)local_c0);
          psVar5 = EnumValueDescriptor::name_abi_cxx11_(*ppEVar7);
          std::operator+(&local_180,&local_1a0,psVar5);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_160,&local_180,
                         ". This will make the proto fail to compile for some languages, such as C#."
                        );
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_1c0);
          this_00 = EnumDescriptor::file((EnumDescriptor *)remover.prefix_.field_2._8_8_);
          SVar4 = FileDescriptor::syntax(this_00);
          if (SVar4 == SYNTAX_PROTO2) {
            psVar5 = EnumValueDescriptor::full_name_abi_cxx11_
                               ((EnumValueDescriptor *)stripped.field_2._8_8_);
            pEVar8 = EnumDescriptorProto::value(proto,local_84);
            AddWarning(this,psVar5,&pEVar8->super_Message,NAME,(string *)local_160);
          }
          else {
            psVar5 = EnumValueDescriptor::full_name_abi_cxx11_
                               ((EnumValueDescriptor *)stripped.field_2._8_8_);
            pEVar8 = EnumDescriptorProto::value(proto,local_84);
            AddError(this,psVar5,&pEVar8->super_Message,NAME,(string *)local_160);
          }
          std::__cxx11::string::~string((string *)local_160);
        }
      }
    }
    std::__cxx11::string::~string((string *)local_c0);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
          *)local_80);
  anon_unknown_1::PrefixRemover::~PrefixRemover((PrefixRemover *)local_40);
  return;
}

Assistant:

void DescriptorBuilder::CheckEnumValueUniqueness(
    const EnumDescriptorProto& proto, const EnumDescriptor* result) {

  // Check that enum labels are still unique when we remove the enum prefix from
  // values that have it.
  //
  // This will fail for something like:
  //
  //   enum MyEnum {
  //     MY_ENUM_FOO = 0;
  //     FOO = 1;
  //   }
  //
  // By enforcing this reasonable constraint, we allow code generators to strip
  // the prefix and/or PascalCase it without creating conflicts.  This can lead
  // to much nicer language-specific enums like:
  //
  //   enum NameType {
  //     FirstName = 1,
  //     LastName = 2,
  //   }
  //
  // Instead of:
  //
  //   enum NameType {
  //     NAME_TYPE_FIRST_NAME = 1,
  //     NAME_TYPE_LAST_NAME = 2,
  //   }
  PrefixRemover remover(result->name());
  std::map<string, const google::protobuf::EnumValueDescriptor*> values;
  for (int i = 0; i < result->value_count(); i++) {
    const google::protobuf::EnumValueDescriptor* value = result->value(i);
    string stripped =
        EnumValueToPascalCase(remover.MaybeRemove(value->name()));
    std::pair<std::map<string, const google::protobuf::EnumValueDescriptor*>::iterator,
              bool>
        insert_result = values.insert(std::make_pair(stripped, value));
    bool inserted = insert_result.second;

    // We don't throw the error if the two conflicting symbols are identical, or
    // if they map to the same number.  In the former case, the normal symbol
    // duplication error will fire so we don't need to (and its error message
    // will make more sense). We allow the latter case so users can create
    // aliases which add or remove the prefix (code generators that do prefix
    // stripping should de-dup the labels in this case).
    if (!inserted && insert_result.first->second->name() != value->name() &&
        insert_result.first->second->number() != value->number()) {
      string error_message =
          "When enum name is stripped and label is PascalCased (" + stripped +
          "), this value label conflicts with " + values[stripped]->name() +
          ". This will make the proto fail to compile for some languages, such "
          "as C#.";
      // There are proto2 enums out there with conflicting names, so to preserve
      // compatibility we issue only a warning for proto2.
      if (result->file()->syntax() == FileDescriptor::SYNTAX_PROTO2) {
        AddWarning(value->full_name(), proto.value(i),
                   DescriptorPool::ErrorCollector::NAME, error_message);
      } else {
        AddError(value->full_name(), proto.value(i),
                 DescriptorPool::ErrorCollector::NAME, error_message);
      }
    }
  }
}